

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Test1D(SubImageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  deUint32 dVar22;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar24;
  long lVar23;
  
  iVar21 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar21);
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x1403,s_reference);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                     "texture is not the name of an existing texture object.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,this->m_format_invalid,0x1403,s_reference);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x500,"glTextureSubImage1D",
                     "format is not an accepted format constant.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,this->m_type_invalid,s_reference);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x500,"glTextureSubImage1D",
                     "type is not an accepted type constant.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0xffffffff,0,4,0x8227,0x1403,s_reference);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x501,"glTextureSubImage1D",
                     "level is less than 0.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,this->m_max_texture_size,0,4,0x8227,0x1403,s_reference);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x501,"glTextureSubImage1D",
                     "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE."
                    );
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0xffffffff,4,0x8227,0x1403,s_reference);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x501,"glTextureSubImage1D",
                     "xoffset<-b, where b is the width of the TEXTURE_BORDER.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,1,5,0x8227,0x1403,s_reference);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x501,"glTextureSubImage1D",
                     "(xoffset+width)>(w-b), where w is the TEXTURE_WIDTH, b is the width of the TEXTURE_BORDER."
                    );
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,0xffffffff,0x8227,0x1403,s_reference);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x501,"glTextureSubImage1D",
                     "width is less than 0.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8032,s_reference);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                     "type is UNSIGNED_BYTE_3_3_2 and format is not RGB.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8362,s_reference);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_BYTE_2_3_3_REV and format is not RGB.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8363,s_reference);
  bVar11 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_5_6_5 and format is not RGB.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8364,s_reference);
  bVar12 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_5_6_5_REV and format is not RGB.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8033,s_reference);
  bVar13 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_4_4_4_4 and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8365,s_reference);
  bVar14 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_4_4_4_4_REV and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8034,s_reference);
  bVar15 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_5_5_5_1 and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8366,s_reference);
  bVar16 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_SHORT_1_5_5_5_REV and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8035,s_reference);
  bVar17 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_INT_8_8_8_8 and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8367,s_reference);
  bVar18 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_INT_8_8_8_8_REV and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8036,s_reference);
  bVar19 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_INT_10_10_10_2 and format is neither RGBA nor BGRA.");
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x8368,s_reference);
  bVar20 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                      "type is UNSIGNED_INT_2_10_10_10_REV and format is neither RGBA nor BGRA.");
  bVar1 = (bVar20 && (bVar19 && (bVar18 && bVar17))) &&
          ((bVar16 && (bVar15 && (bVar14 && (bVar13 && bVar12)))) &&
          ((bVar11 && (bVar10 && (bVar9 && bVar8))) &&
          ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)))));
  (**(code **)(lVar23 + 0x40))(0x88ec,this->m_bo);
  dVar22 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar22,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x25a8);
  (**(code **)(lVar23 + 0xcf8))(0x88ec,0x88ba);
  iVar21 = (**(code **)(lVar23 + 0x800))();
  if (iVar21 == 0) {
    pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
    (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x1403,0);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                       "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                      );
    bVar1 = bVar1 && bVar2;
    (**(code **)(lVar23 + 0x1670))(0x88ec);
    dVar22 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar22,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x25b4);
    (**(code **)(lVar23 + 0x40))(0x88ec,0);
    dVar22 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar22,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x25b7);
  }
  (**(code **)(lVar23 + 0x40))(0x88ec,this->m_bo);
  dVar22 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar22,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x25c1);
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x1403,0x400);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                     "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size."
                    );
  (**(code **)(lVar23 + 0x40))(0x88ec,0);
  dVar22 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar22,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x25cb);
  (**(code **)(lVar23 + 0x40))(0x88ec,this->m_bo);
  dVar22 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar22,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x25d4);
  pEVar24 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar23 + 0x1480))(pEVar24,0,0,4,0x8227,0x1403,1);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar24,(this->super_TestCase).m_context,0x502,"glTextureSubImage1D",
                     "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and pixels is not evenly divisible into the number of bytes needed to store in memory a datum indicated by type."
                    );
  (**(code **)(lVar23 + 0x40))(0x88ec,0);
  dVar22 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar22,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x25de);
  return (bool)((bVar3 && bVar2) & bVar1);
}

Assistant:

bool SubImageErrorsTest::Test1D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if
	 texture is not the name of an existing texture object. */
	{
		gl.textureSubImage1D(m_to_invalid, 0, 0, s_reference_width, s_reference_format, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_ENUM is generated by TextureSubImage1D if format is
	 not an accepted format constant. */
	{
		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, m_format_invalid, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureSubImage1D",
								  "format is not an accepted format constant.");
	}

	/* Check that INVALID_ENUM is generated by TextureSubImage1D if type is not
	 an accepted type constant. */
	{
		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, m_type_invalid, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureSubImage1D",
								  "type is not an accepted type constant.");
	}

	/* Check that INVALID_VALUE is generated by TextureSubImage1D if level is
	 less than 0. */
	{
		gl.textureSubImage1D(m_to_1D, -1, 0, s_reference_width, s_reference_format, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureSubImage1D", "level is less than 0.");
	}

	/* Check that INVALID_VALUE may be generated by TextureSubImage1D if level
	 is greater than log2 max, where max is the returned value of
	 MAX_TEXTURE_SIZE. */
	{
		gl.textureSubImage1D(m_to_1D, m_max_texture_size, 0, s_reference_width, s_reference_format, s_reference_type,
							 s_reference);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureSubImage1D",
							 "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE.");
	}

	/* Check that INVALID_VALUE is generated by TextureSubImage1D if
	 xoffset<-b, or if (xoffset+width)>(w-b), where w is the TEXTURE_WIDTH,
	 and b is the width of the TEXTURE_BORDER of the texture image being
	 modified. Note that w includes twice the border width. */
	{
		gl.textureSubImage1D(m_to_1D, 0, -1, s_reference_width, s_reference_format, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureSubImage1D",
								  "xoffset<-b, where b is the width of the TEXTURE_BORDER.");

		gl.textureSubImage1D(m_to_1D, 0, 1, s_reference_width + 1, s_reference_format, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_VALUE, "glTextureSubImage1D",
			"(xoffset+width)>(w-b), where w is the TEXTURE_WIDTH, b is the width of the TEXTURE_BORDER.");
	}

	/*Check that INVALID_VALUE is generated by TextureSubImage1D if width is less than 0. */
	{
#ifndef TURN_OFF_SUB_IMAGE_ERRORS_TEST_OF_NEGATIVE_WIDTH_HEIGHT_OR_DEPTH
		gl.textureSubImage1D(m_to_1D, 0, 0, -1, s_reference_format, s_reference_type, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureSubImage1D", "width is less than 0.");
#endif
	}

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if type
	 is one of UNSIGNED_BYTE_3_3_2, UNSIGNED_BYTE_2_3_3_REV,
	 UNSIGNED_SHORT_5_6_5, or UNSIGNED_SHORT_5_6_5_REV and format is not RGB. */
	{
		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_BYTE_3_3_2, s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_BYTE_3_3_2 and format is not RGB.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_BYTE_2_3_3_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_BYTE_2_3_3_REV and format is not RGB.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_5_6_5,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_5_6_5 and format is not RGB.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_5_6_5_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_5_6_5_REV and format is not RGB.");
	}

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if type
	 is one of UNSIGNED_SHORT_4_4_4_4, UNSIGNED_SHORT_4_4_4_4_REV,
	 UNSIGNED_SHORT_5_5_5_1, UNSIGNED_SHORT_1_5_5_5_REV,
	 UNSIGNED_INT_8_8_8_8, UNSIGNED_INT_8_8_8_8_REV, UNSIGNED_INT_10_10_10_2,
	 or UNSIGNED_INT_2_10_10_10_REV and format is neither RGBA nor BGRA. */
	{
		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_4_4_4_4,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_4_4_4_4 and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_4_4_4_4_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_4_4_4_4_REV and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_5_5_5_1,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_5_5_5_1 and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_SHORT_1_5_5_5_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_SHORT_1_5_5_5_REV and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_INT_8_8_8_8,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_INT_8_8_8_8 and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_INT_8_8_8_8_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_INT_8_8_8_8_REV and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_INT_10_10_10_2,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_INT_10_10_10_2 and format is neither RGBA nor BGRA.");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, GL_UNSIGNED_INT_2_10_10_10_REV,
							 s_reference);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "type is UNSIGNED_INT_2_10_10_10_REV and format is neither RGBA nor BGRA.");
	}

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if a
	 non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target
	 and the buffer object's data store is currently mapped. */
	{
		gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.mapBuffer(GL_PIXEL_UNPACK_BUFFER, GL_READ_WRITE);

		if (GL_NO_ERROR == gl.getError())
		{
			gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, s_reference_type, NULL);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
									  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and "
									  "the buffer object's data store is currently mapped.");

			gl.unmapBuffer(GL_PIXEL_UNPACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
		}
	}

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if a
	 non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target
	 and the data would be unpacked from the buffer object such that the
	 memory reads required would exceed the data store size. */
	{
		gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, s_reference_type,
							 (glw::GLubyte*)NULL + s_reference_size * 2);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the "
								  "data would be unpacked from the buffer object such that the memory reads required "
								  "would exceed the data store size.");

		gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
	}

	/* Check that INVALID_OPERATION is generated by TextureSubImage1D if a
	 non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target
	 and pixels is not evenly divisible into the number of bytes needed to
	 store in memory a datum indicated by type. */
	{
		gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.textureSubImage1D(m_to_1D, 0, 0, s_reference_width, s_reference_format, s_reference_type,
							 (glw::GLubyte*)NULL + 1);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureSubImage1D",
								  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and pixels "
								  "is not evenly divisible into the number of bytes needed to store in memory a datum "
								  "indicated by type.");

		gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
	}

	return is_ok;
}